

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

int Cbs2_ManSolve2_rec(Cbs2_Man_t *p,int Level)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  Gia_Obj_t *pGVar7;
  char *pcVar8;
  int *piVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  int iDecLit2;
  int local_34;
  
  iVar12 = (p->pProp).iHead;
  if (iVar12 == (p->pProp).iTail) {
    __assert_fail("!Cbs2_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x523,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
  }
  iVar11 = Cbs2_ManPropagate2(p,Level);
  if (iVar11 != 0) {
    return iVar11;
  }
  if ((p->pProp).iHead != (p->pProp).iTail) {
    __assert_fail("Cbs2_QueIsEmpty(&p->pProp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x527,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
  }
  iVar12 = Cbs2_ManUpdateFrontier(p,iVar12,&local_34);
  if (iVar12 != 0) {
    return 0;
  }
  iVar12 = (p->Pars).nBTThis;
  iVar11 = (p->Pars).nJustThis;
  iVar3 = (p->pJust).iTail;
  iVar4 = (p->pJust).iHead;
  iVar13 = iVar3 - iVar4;
  if (iVar11 <= iVar13) {
    iVar11 = iVar13;
  }
  (p->Pars).nJustThis = iVar11;
  bVar20 = (p->Pars).nJustLimit < iVar11;
  p->nFails[0] = p->nFails[0] + (uint)bVar20;
  bVar10 = (p->Pars).nBTLimit < iVar12;
  p->nFails[1] = p->nFails[1] + (uint)bVar10;
  if (bVar10 || bVar20) {
    return 0;
  }
  if ((p->Pars).fUseHighest == 0) {
    __assert_fail("p->Pars.fUseHighest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x537,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
  }
  iVar12 = (p->pProp).iHead;
  uVar18 = 0;
  if (iVar4 < iVar3) {
    lVar15 = 0;
    uVar18 = 0;
    do {
      uVar14 = (p->pJust).pData[iVar4 + lVar15];
      if (uVar14 == 0) break;
      uVar16 = uVar14;
      if ((int)uVar14 < (int)uVar18) {
        uVar16 = uVar18;
      }
      bVar20 = uVar18 == 0;
      uVar18 = uVar16;
      if (bVar20) {
        uVar18 = uVar14;
      }
      lVar15 = lVar15 + 1;
    } while (iVar13 != (int)lVar15);
    if ((int)uVar18 < 0) goto LAB_00720cd8;
  }
  pGVar6 = p->pAig;
  if (pGVar6->nObjs <= (int)uVar18) {
LAB_00720cd8:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar7 = pGVar6->pObjs;
  uVar14 = (uint)*(undefined8 *)(pGVar7 + uVar18);
  if ((-1 < (int)uVar14) && ((uVar14 & 0x1fffffff) != 0x1fffffff)) {
    uVar16 = uVar18 - (uVar14 & 0x1fffffff);
    if (((int)uVar16 < 0) || (uVar5 = (p->vAssign).nSize, (int)uVar5 <= (int)uVar16)) {
LAB_00720c7b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    pcVar8 = (p->vAssign).pArray;
    if ('\x01' < pcVar8[uVar16]) {
      uVar17 = (uint)((ulong)*(undefined8 *)(pGVar7 + uVar18) >> 0x20);
      uVar19 = uVar18 - (uVar17 & 0x1fffffff);
      if (((int)uVar19 < 0) || (uVar5 <= uVar19)) goto LAB_00720c7b;
      if ('\x01' < pcVar8[uVar19]) {
        pGVar1 = pGVar7 + ((ulong)uVar18 - (ulong)(uVar14 & 0x1fffffff));
        if ((((pGVar1 < pGVar7) || (pGVar7 + (uint)pGVar6->nObjs <= pGVar1)) ||
            (pGVar2 = pGVar7 + ((ulong)uVar18 - (ulong)(uVar17 & 0x1fffffff)), pGVar2 < pGVar7)) ||
           (pGVar7 + (uint)pGVar6->nObjs <= pGVar2)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar13 = pGVar6->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar7) >> 2) * -0x55555555];
        iVar11 = pGVar6->pRefs[(int)((ulong)((long)pGVar2 - (long)pGVar7) >> 2) * -0x55555555];
        if (iVar11 < iVar13) {
          uVar17 = uVar14;
        }
        if (iVar11 < iVar13) {
          uVar19 = uVar16;
        }
        uVar18 = (uVar17 >> 0x1d & 1) + uVar19 * 2;
        iVar13 = Level + 1;
        Cbs2_ManAssign(p,uVar18 ^ 1,iVar13,0,0);
        iVar11 = Cbs2_ManSolve2_rec(p,iVar13);
        if (iVar11 == 0) {
          return 0;
        }
        uVar14 = (p->pClauses).pData[(long)iVar11 + 1];
        if (uVar14 != uVar19) {
          return iVar11;
        }
        Cbs2_ManCancelUntil(p,iVar12);
        (p->pJust).iHead = iVar4;
        (p->pJust).iTail = iVar3;
        Cbs2_ManAssign(p,uVar18,iVar13,0,0);
        iVar12 = Cbs2_ManSolve2_rec(p,iVar13);
        if (iVar12 == 0) {
          return 0;
        }
        piVar9 = (p->pClauses).pData;
        if (piVar9[(long)iVar12 + 1] != uVar14) {
          return iVar12;
        }
        iVar12 = Cbs2_ManResolve(p,iVar11,iVar12,(int)piVar9);
        if ((p->pClauses).iHead == (p->pClauses).iTail) {
          piVar9 = &(p->Pars).nBTThis;
          *piVar9 = *piVar9 + 1;
          return iVar12;
        }
        __assert_fail("Cbs2_QueIsEmpty( &p->pClauses )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x270,"void Cbs2_ManBumpClause(Cbs2_Man_t *, int)");
      }
    }
  }
  __assert_fail("Cbs2_VarIsJust(p, pVar, iVar)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                ,0x53a,"int Cbs2_ManSolve2_rec(Cbs2_Man_t *, int)");
}

Assistant:

int Cbs2_ManSolve2_rec( Cbs2_Man_t * p, int Level )
{ 
    Gia_Obj_t * pVar;
    Cbs2_Que_t * pQue = &(p->pClauses);
    int iPropHead, iJustHead, iJustTail;
    int hClause, hLearn0, hLearn1, iVar, iDecLit, iDecLit2;
    int iPropHeadOld = p->pProp.iHead;
    // propagate assignments
    assert( !Cbs2_QueIsEmpty(&p->pProp) );
    if ( (hClause = Cbs2_ManPropagate2( p, Level )) )
        return hClause;
    // check for satisfying assignment
    assert( Cbs2_QueIsEmpty(&p->pProp) );
//    if ( Cbs2_QueIsEmpty(&p->pJust) )
//        return 0;
    if ( Cbs2_ManUpdateFrontier(p, iPropHeadOld, &iDecLit2) )
        return 0;
    // quit using resource limits
    p->Pars.nJustThis = Abc_MaxInt( p->Pars.nJustThis, p->pJust.iTail - p->pJust.iHead );
    if ( Cbs2_ManCheckLimits( p ) )
        return 0;
    // remember the state before branching
    iPropHead = p->pProp.iHead;
//    Cbs2_QueStore( &p->pJust, &iJustHead, &iJustTail );
    iJustHead = p->pJust.iHead;
    iJustTail = p->pJust.iTail;
    // find the decision variable

    assert( p->Pars.fUseHighest );
    iVar = Cbs2_ManDecideHighest( p );
    pVar = Gia_ManObj( p->pAig, iVar );
    assert( Cbs2_VarIsJust(p, pVar, iVar) );
    // chose decision variable using fanout count
    if ( Gia_ObjRefNum(p->pAig, Gia_ObjFanin0(pVar)) > Gia_ObjRefNum(p->pAig, Gia_ObjFanin1(pVar)) )
//    if ( Vec_IntEntry(&p->vActivity, Gia_ObjFaninId0(pVar, iVar)) > Vec_IntEntry(&p->vActivity, Gia_ObjFaninId1(pVar, iVar)) )
        iDecLit = Abc_LitNot(Gia_ObjFaninLit0(pVar, iVar));
    else
        iDecLit = Abc_LitNot(Gia_ObjFaninLit1(pVar, iVar));

    //iDecLit = iDecLit2;

    // decide on first fanin
    Cbs2_ManAssign( p, iDecLit, Level+1, 0, 0 );
    if ( !(hLearn0 = Cbs2_ManSolve2_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn0+1] != Abc_Lit2Var(iDecLit) )
        return hLearn0;
    Cbs2_ManCancelUntil( p, iPropHead );
    Cbs2_QueRestore( &p->pJust, iJustHead, iJustTail );
    // decide on second fanin
    Cbs2_ManAssign( p, Abc_LitNot(iDecLit), Level+1, 0, 0 );
    if ( !(hLearn1 = Cbs2_ManSolve2_rec( p, Level+1 )) )
        return 0;
    if ( pQue->pData[hLearn1+1] != Abc_Lit2Var(iDecLit) )
        return hLearn1;
    hClause = Cbs2_ManResolve( p, Level, hLearn0, hLearn1 );
    Cbs2_ManBumpClause( p, hClause );
    //Cbs2_ManPrintCube( p, Level, hClause );
//    if ( Level > Cbs2_ClauseDecLevel(p, hClause) )
//        p->Pars.nBTThisNc++;
    p->Pars.nBTThis++;
    return hClause;
}